

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall
soul::StructuralParser::parseEndpoint
          (StructuralParser *this,ProcessorBase *p,bool isInput,bool alreadyInsideBracedExpression)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000009;
  EndpointType endpointType;
  CompileMessage local_60;
  
  if (((int)CONCAT71(in_register_00000009,alreadyInsideBracedExpression) == 0) &&
     (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d4b), bVar1)) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2886a0);
    while (!bVar1) {
      parseEndpoint(this,p,isInput,true);
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2886a0);
    }
  }
  else {
    iVar2 = (*(p->super_ModuleBase).super_ASTObject._vptr_ASTObject[5])(p);
    if ((((char)iVar2 != '\0') &&
        (((__s1 = (this->super_SOULTokeniser).currentType.text, __s1 == "$identifier" ||
          ((__s1 != (char *)0x0 && (iVar2 = strcmp(__s1,"$identifier"), iVar2 == 0)))) &&
         (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,"value"), !bVar1)))) &&
       ((bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matches(&this->super_SOULTokeniser,"stream"), !bVar1 &&
        (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matches(&this->super_SOULTokeniser,"event"), !bVar1)))) {
      parseChildEndpoint(this,p,isInput);
      return;
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"value");
    endpointType = value;
    if (!bVar1) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"stream");
      endpointType = stream;
      if (!bVar1) {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"event");
        endpointType = event;
        if (!bVar1) {
          CompileMessageHelpers::createMessage<>
                    (&local_60,syntax,error,"Expected a stream type specifier");
          (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60.description._M_dataplus._M_p != &local_60.description.field_2) {
            operator_delete(local_60.description._M_dataplus._M_p,
                            local_60.description.field_2._M_allocated_capacity + 1);
          }
          endpointType = value;
        }
      }
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d4b);
    if (bVar1) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2886a0);
      while (!bVar1) {
        parseEndpoint(this,p,isInput,endpointType);
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2886a0);
      }
    }
    else {
      parseEndpoint(this,p,isInput,endpointType);
    }
  }
  return;
}

Assistant:

void parseEndpoint (AST::ProcessorBase& p, bool isInput, bool alreadyInsideBracedExpression = false)
    {
        if (! alreadyInsideBracedExpression && matchIf (Operator::openBrace))
        {
            while (! matchIf (Operator::closeBrace))
                parseEndpoint (p, isInput, true);
        }
        else
        {
            if (p.isGraph() && matches (Token::identifier) && ! isNextTokenEndpointType (*this))
                return parseChildEndpoint (p, isInput);

            auto endpointType = parseEndpointType (*this);

            if (matchIf (Operator::openBrace))
            {
                while (! matchIf (Operator::closeBrace))
                    parseEndpoint (p, isInput, endpointType);
            }
            else
            {
                parseEndpoint (p, isInput, endpointType);
            }
        }
    }